

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O2

LIndex __thiscall
PlanningUnitMADPDiscrete::GetNrPolicies(PlanningUnitMADPDiscrete *this,Index agentI)

{
  int iVar1;
  size_t sVar2;
  undefined4 extraout_var;
  ulong uVar3;
  EOverflow *this_00;
  size_t sVar4;
  ulong uVar5;
  bool bVar6;
  
  sVar4 = 0xffffffffffffffff;
  uVar5 = 1;
  do {
    sVar2 = GetNrObservationHistories(this,agentI);
    sVar4 = sVar4 + 1;
    if (sVar4 == sVar2) {
      return uVar5;
    }
    iVar1 = (*(this->super_PlanningUnit)._vptr_PlanningUnit[7])(this,agentI);
    uVar3 = CONCAT44(extraout_var,iVar1) * uVar5;
    bVar6 = uVar5 <= uVar3;
    uVar5 = uVar3;
  } while (bVar6);
  this_00 = (EOverflow *)__cxa_allocate_exception(0x28);
  EOverflow::EOverflow(this_00,"PlanningUnitMADPDiscrete::GetNrPolicies() overflow detected");
  __cxa_throw(this_00,&EOverflow::typeinfo,E::~E);
}

Assistant:

LIndex PlanningUnitMADPDiscrete::GetNrPolicies(Index agentI) const
{
#if 0 // don't use powl(), we want to detect overflow
    return( static_cast<LIndex>(powl( GetNrActions(agentI), 
                                      GetNrObservationHistories(agentI))));
#endif
    LIndex nrPols=1;
    for(size_t k=0;k!=GetNrObservationHistories(agentI);++k)
    {
        LIndex nrPolsOld=nrPols;
        nrPols*=GetNrActions(agentI);
        if(nrPols<nrPolsOld)
            throw(EOverflow("PlanningUnitMADPDiscrete::GetNrPolicies() overflow detected"));
    }
    return(nrPols);
}